

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,sunrealtype beta)

{
  SUNContext sunctx_local_scope_;
  sunrealtype beta_local;
  SUNNonlinearSolver NLS_local;
  
  if (1.0 <= beta) {
    *(undefined8 *)((long)NLS->content + 0x28) = 0x3ff0000000000000;
    *(undefined4 *)((long)NLS->content + 0x20) = 0;
  }
  else {
    *(sunrealtype *)((long)NLS->content + 0x28) = beta;
    *(undefined4 *)((long)NLS->content + 0x20) = 1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,
                                             sunrealtype beta)
{
  SUNFunctionBegin(NLS->sunctx);
  SUNAssert(beta > 0, SUN_ERR_ARG_OUTOFRANGE);

  if (beta < ONE)
  {
    /* enable damping */
    FP_CONTENT(NLS)->beta    = beta;
    FP_CONTENT(NLS)->damping = SUNTRUE;
  }
  else
  {
    /* disable damping */
    FP_CONTENT(NLS)->beta    = ONE;
    FP_CONTENT(NLS)->damping = SUNFALSE;
  }

  return SUN_SUCCESS;
}